

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O0

Abc_Cex_t *
Gia_ManCexMin(Gia_Man_t *p,Abc_Cex_t *pCex,int iFrameStart,int nRealPis,int fJustMax,int fUseAll,
             int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  uint local_34;
  int RetValue;
  int f;
  Gia_Man_t *pNew;
  int fUseAll_local;
  int fJustMax_local;
  int nRealPis_local;
  int iFrameStart_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  iVar2 = pCex->nPis;
  iVar1 = Gia_ManPiNum(p);
  if (iVar2 != iVar1) {
    __assert_fail("pCex->nPis == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexMin2.c"
                  ,0x142,
                  "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
  }
  iVar2 = pCex->iPo;
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 <= iVar2) {
    __assert_fail("pCex->iPo < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexMin2.c"
                  ,0x144,
                  "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
  }
  if ((-1 < iFrameStart) && (iFrameStart <= pCex->iFrame)) {
    iVar2 = Gia_ManPiNum(p);
    if (iVar2 <= nRealPis) {
      __assert_fail("nRealPis < Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexMin2.c"
                    ,0x148,
                    "Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)");
    }
    Gia_ManAnnotateUnrolling(p,pCex,fJustMax);
    if (nRealPis < 0) {
      for (local_34 = pCex->iFrame; iFrameStart <= (int)local_34; local_34 = local_34 - 1) {
        pGVar3 = Gia_ManCreateUnate(p,pCex,local_34,-1,fUseAll);
        printf("%3d : ",(ulong)local_34);
        Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
        if (fVerbose != 0) {
          Gia_AigerWrite(pGVar3,"temp.aig",0,0);
        }
        Gia_ManStop(pGVar3);
      }
    }
    else {
      pGVar3 = Gia_ManCreateUnate(p,pCex,iFrameStart,nRealPis,fUseAll);
      printf("%3d : ",(ulong)(uint)iFrameStart);
      Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
      if (fVerbose != 0) {
        Gia_AigerWrite(pGVar3,"temp.aig",0,0);
      }
      Gia_ManStop(pGVar3);
    }
    Vec_IntFreeP(&p->vTruths);
    p->nTtWords = 0;
    return (Abc_Cex_t *)0x0;
  }
  __assert_fail("iFrameStart >= 0 && iFrameStart <= pCex->iFrame",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexMin2.c"
                ,0x146,"Abc_Cex_t *Gia_ManCexMin(Gia_Man_t *, Abc_Cex_t *, int, int, int, int, int)"
               );
}

Assistant:

Abc_Cex_t * Gia_ManCexMin( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrameStart, int nRealPis, int fJustMax, int fUseAll, int fVerbose )
{
    Gia_Man_t * pNew;
    int f, RetValue;
    // check CEX
    assert( pCex->nPis == Gia_ManPiNum(p) );
//    assert( pCex->nRegs == Gia_ManRegNum(p) );
    assert( pCex->iPo < Gia_ManPoNum(p) );
    // check frames
    assert( iFrameStart >= 0 && iFrameStart <= pCex->iFrame );
    // check primary inputs
    assert( nRealPis < Gia_ManPiNum(p) );
    // prepare
    RetValue = Gia_ManAnnotateUnrolling( p, pCex, fJustMax );
    if ( nRealPis >= 0 ) // refinement
    {
        pNew = Gia_ManCreateUnate( p, pCex, iFrameStart, nRealPis, fUseAll );
        printf( "%3d : ", iFrameStart );
        Gia_ManPrintStats( pNew, NULL );
        if ( fVerbose )
            Gia_AigerWrite( pNew, "temp.aig", 0, 0 );
        Gia_ManStop( pNew );
    }
    else // CEX min
    {
        for ( f = pCex->iFrame; f >= iFrameStart; f-- )
        {
            pNew = Gia_ManCreateUnate( p, pCex, f, -1, fUseAll );
            printf( "%3d : ", f );
            Gia_ManPrintStats( pNew, NULL );
            if ( fVerbose )
                Gia_AigerWrite( pNew, "temp.aig", 0, 0 );
            Gia_ManStop( pNew );
        }
    }
    Vec_IntFreeP( &p->vTruths );
    p->nTtWords = 0;
    return NULL;
}